

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_tar_ustar.c
# Opt level: O1

void test_write_format_tar_ustar(void)

{
  byte bVar1;
  byte bVar6;
  ushort uVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  int iVar25;
  long lVar26;
  undefined4 *buff;
  archive *_a;
  archive_entry *paVar27;
  ssize_t sVar28;
  char cVar29;
  uint uVar30;
  char cVar31;
  char *pcVar32;
  char cVar33;
  wchar_t wVar34;
  wchar_t wVar35;
  undefined1 auVar36 [16];
  uint uVar38;
  int iVar39;
  undefined1 auVar37 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  uint uVar45;
  int iVar48;
  undefined1 auVar46 [14];
  int iVar50;
  undefined1 auVar51 [16];
  uint uVar52;
  uint uVar53;
  undefined1 auVar54 [14];
  int iVar58;
  undefined1 auVar55 [16];
  int iVar60;
  undefined1 auVar56 [16];
  int iVar61;
  uint uVar62;
  int iVar64;
  undefined1 auVar63 [16];
  int iVar66;
  size_t used;
  char f99 [100];
  char f100 [101];
  char f256 [257];
  byte bVar2;
  char cVar3;
  byte bVar4;
  byte bVar5;
  byte bVar7;
  char cVar8;
  char cVar9;
  byte bVar10;
  byte bVar11;
  char cVar12;
  char cVar13;
  long lVar43;
  undefined1 auVar47 [16];
  int iVar49;
  undefined1 auVar57 [16];
  int iVar59;
  int iVar65;
  
  lVar26 = 100;
  cVar29 = 'b';
  uVar30 = 0;
  cVar31 = 'a';
  pcVar32 = f99 + 1;
  auVar40 = _DAT_0023d010;
  do {
    cVar33 = (char)(uVar30 / 0x1a) * '\x19' + (char)(uVar30 / 0x1a);
    if (SUB164(auVar40 ^ _DAT_0023d020,4) == -0x80000000 &&
        SUB164(auVar40 ^ _DAT_0023d020,0) < -0x7fffff9d) {
      pcVar32[-1] = cVar31 - cVar33;
      *pcVar32 = cVar29 - cVar33;
    }
    lVar43 = auVar40._8_8_;
    auVar40._0_8_ = auVar40._0_8_ + 2;
    auVar40._8_8_ = lVar43 + 2;
    pcVar32 = pcVar32 + 2;
    cVar29 = cVar29 + '\x02';
    uVar30 = uVar30 + 2;
    cVar31 = cVar31 + '\x02';
    lVar26 = lVar26 + -2;
  } while (lVar26 != 0);
  f99[99] = '\0';
  lVar26 = 100;
  cVar29 = 'B';
  uVar30 = 0;
  cVar31 = 'A';
  pcVar32 = f100 + 1;
  auVar41 = _DAT_0023d010;
  do {
    cVar33 = (char)(uVar30 / 0x1a) * '\x19' + (char)(uVar30 / 0x1a);
    if (SUB164(auVar41 ^ _DAT_0023d020,4) == -0x80000000 &&
        SUB164(auVar41 ^ _DAT_0023d020,0) < -0x7fffff9c) {
      pcVar32[-1] = cVar31 - cVar33;
      *pcVar32 = cVar29 - cVar33;
    }
    lVar43 = auVar41._8_8_;
    auVar41._0_8_ = auVar41._0_8_ + 2;
    auVar41._8_8_ = lVar43 + 2;
    pcVar32 = pcVar32 + 2;
    cVar29 = cVar29 + '\x02';
    uVar30 = uVar30 + 2;
    cVar31 = cVar31 + '\x02';
    lVar26 = lVar26 + -2;
  } while (lVar26 != 0);
  f100[100] = '\0';
  lVar26 = 0;
  auVar36 = _DAT_002627d0;
  auVar37 = _DAT_002627e0;
  auVar42 = _DAT_002627f0;
  auVar44 = _DAT_00262800;
  do {
    uVar38 = auVar37._4_4_;
    iVar39 = auVar37._12_4_;
    auVar51._4_4_ = uVar38;
    auVar51._0_4_ = uVar38;
    auVar51._8_4_ = iVar39;
    auVar51._12_4_ = iVar39;
    uVar45 = auVar37._0_4_ % 0x1a;
    iVar49 = auVar37._8_4_;
    iVar48 = iVar49 - (int)(((auVar37._8_8_ & 0xffffffff) / 0x1a) * 0x1a);
    iVar50 = iVar39 - (int)(((auVar51._8_8_ & 0xffffffff) / 0x1a) * 0x1a);
    uVar30 = auVar36._4_4_;
    iVar25 = auVar36._12_4_;
    auVar55._4_4_ = uVar30;
    auVar55._0_4_ = uVar30;
    auVar55._8_4_ = iVar25;
    auVar55._12_4_ = iVar25;
    uVar52 = auVar36._0_4_ % 0x1a;
    iVar59 = auVar36._8_4_;
    iVar58 = iVar59 - (int)(((auVar36._8_8_ & 0xffffffff) / 0x1a) * 0x1a);
    iVar60 = iVar25 - (int)(((auVar55._8_8_ & 0xffffffff) / 0x1a) * 0x1a);
    uVar14 = (ushort)uVar45;
    bVar1 = (uVar14 != 0) * (uVar14 < 0x100) * (char)uVar45 - (0xff < uVar14);
    uVar14 = (ushort)(uVar38 % 0x1a);
    bVar2 = (uVar14 != 0) * (uVar14 < 0x100) * (char)(uVar38 % 0x1a) - (0xff < uVar14);
    sVar15 = (short)iVar48;
    cVar3 = (0 < sVar15) * (sVar15 < 0x100) * (char)iVar48 - (0xff < sVar15);
    sVar15 = (short)((uint)iVar48 >> 0x10);
    sVar21 = CONCAT11((0 < sVar15) * (sVar15 < 0x100) * (char)((uint)iVar48 >> 0x10) -
                      (0xff < sVar15),cVar3);
    sVar15 = (short)iVar50;
    cVar29 = (0 < sVar15) * (sVar15 < 0x100) * (char)iVar50 - (0xff < sVar15);
    sVar15 = (short)((uint)iVar50 >> 0x10);
    uVar23 = CONCAT13((0 < sVar15) * (sVar15 < 0x100) * (char)((uint)iVar50 >> 0x10) -
                      (0xff < sVar15),CONCAT12(cVar29,sVar21));
    uVar14 = (ushort)uVar52;
    bVar4 = (uVar14 != 0) * (uVar14 < 0x100) * (char)uVar52 - (0xff < uVar14);
    auVar46._0_10_ = (unkuint10)CONCAT14(bVar4,uVar23) << 0x20;
    uVar14 = (ushort)(uVar30 % 0x1a);
    bVar5 = (uVar14 != 0) * (uVar14 < 0x100) * (char)(uVar30 % 0x1a) - (0xff < uVar14);
    auVar46[10] = bVar5;
    auVar46[0xb] = 0;
    sVar15 = (short)iVar58;
    cVar33 = (0 < sVar15) * (sVar15 < 0x100) * (char)iVar58 - (0xff < sVar15);
    auVar46[0xc] = cVar33;
    sVar15 = (short)((uint)iVar58 >> 0x10);
    auVar46[0xd] = (0 < sVar15) * (sVar15 < 0x100) * (char)((uint)iVar58 >> 0x10) - (0xff < sVar15);
    sVar15 = (short)iVar60;
    cVar31 = (0 < sVar15) * (sVar15 < 0x100) * (char)iVar60 - (0xff < sVar15);
    auVar47[0xe] = cVar31;
    auVar47._0_14_ = auVar46;
    sVar15 = (short)((uint)iVar60 >> 0x10);
    auVar47[0xf] = (0 < sVar15) * (sVar15 < 0x100) * (char)((uint)iVar60 >> 0x10) - (0xff < sVar15);
    uVar52 = auVar44._4_4_;
    iVar50 = auVar44._12_4_;
    auVar56._4_4_ = uVar52;
    auVar56._0_4_ = uVar52;
    auVar56._8_4_ = iVar50;
    auVar56._12_4_ = iVar50;
    uVar53 = auVar44._0_4_ % 0x1a;
    iVar58 = auVar44._8_4_;
    iVar60 = iVar58 - (int)(((auVar44._8_8_ & 0xffffffff) / 0x1a) * 0x1a);
    iVar61 = iVar50 - (int)(((auVar56._8_8_ & 0xffffffff) / 0x1a) * 0x1a);
    uVar45 = auVar42._4_4_;
    iVar48 = auVar42._12_4_;
    auVar63._4_4_ = uVar45;
    auVar63._0_4_ = uVar45;
    auVar63._8_4_ = iVar48;
    auVar63._12_4_ = iVar48;
    uVar62 = auVar42._0_4_ % 0x1a;
    iVar65 = auVar42._8_4_;
    iVar64 = iVar65 - (int)(((auVar42._8_8_ & 0xffffffff) / 0x1a) * 0x1a);
    iVar66 = iVar48 - (int)(((auVar63._8_8_ & 0xffffffff) / 0x1a) * 0x1a);
    uVar14 = (ushort)uVar53;
    bVar6 = (uVar14 != 0) * (uVar14 < 0x100) * (char)uVar53 - (0xff < uVar14);
    uVar14 = (ushort)(uVar52 % 0x1a);
    bVar7 = (uVar14 != 0) * (uVar14 < 0x100) * (char)(uVar52 % 0x1a) - (0xff < uVar14);
    sVar15 = (short)iVar60;
    cVar8 = (0 < sVar15) * (sVar15 < 0x100) * (char)iVar60 - (0xff < sVar15);
    sVar15 = (short)((uint)iVar60 >> 0x10);
    sVar22 = CONCAT11((0 < sVar15) * (sVar15 < 0x100) * (char)((uint)iVar60 >> 0x10) -
                      (0xff < sVar15),cVar8);
    sVar15 = (short)iVar61;
    cVar9 = (0 < sVar15) * (sVar15 < 0x100) * (char)iVar61 - (0xff < sVar15);
    sVar15 = (short)((uint)iVar61 >> 0x10);
    uVar24 = CONCAT13((0 < sVar15) * (sVar15 < 0x100) * (char)((uint)iVar61 >> 0x10) -
                      (0xff < sVar15),CONCAT12(cVar9,sVar22));
    uVar14 = (ushort)uVar62;
    bVar10 = (uVar14 != 0) * (uVar14 < 0x100) * (char)uVar62 - (0xff < uVar14);
    auVar54._0_10_ = (unkuint10)CONCAT14(bVar10,uVar24) << 0x20;
    uVar14 = (ushort)(uVar45 % 0x1a);
    bVar11 = (uVar14 != 0) * (uVar14 < 0x100) * (char)(uVar45 % 0x1a) - (0xff < uVar14);
    auVar54[10] = bVar11;
    auVar54[0xb] = 0;
    sVar15 = (short)iVar64;
    cVar12 = (0 < sVar15) * (sVar15 < 0x100) * (char)iVar64 - (0xff < sVar15);
    auVar54[0xc] = cVar12;
    sVar15 = (short)((uint)iVar64 >> 0x10);
    auVar54[0xd] = (0 < sVar15) * (sVar15 < 0x100) * (char)((uint)iVar64 >> 0x10) - (0xff < sVar15);
    sVar15 = (short)iVar66;
    cVar13 = (0 < sVar15) * (sVar15 < 0x100) * (char)iVar66 - (0xff < sVar15);
    auVar57[0xe] = cVar13;
    auVar57._0_14_ = auVar54;
    sVar15 = (short)((uint)iVar66 >> 0x10);
    auVar57[0xf] = (0 < sVar15) * (sVar15 < 0x100) * (char)((uint)iVar66 >> 0x10) - (0xff < sVar15);
    sVar15 = (short)((uint)uVar24 >> 0x10);
    sVar16 = auVar54._12_2_;
    sVar17 = auVar57._14_2_;
    sVar18 = (short)((uint)uVar23 >> 0x10);
    sVar19 = auVar46._12_2_;
    sVar20 = auVar47._14_2_;
    f256[lVar26] = ((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)) + 'A';
    f256[lVar26 + 1] = ((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7)) + 'A';
    f256[lVar26 + 2] = ((0 < sVar22) * (sVar22 < 0x100) * cVar8 - (0xff < sVar22)) + 'A';
    f256[lVar26 + 3] = ((0 < sVar15) * (sVar15 < 0x100) * cVar9 - (0xff < sVar15)) + 'A';
    f256[lVar26 + 4] = ((bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10)) + 'A';
    f256[lVar26 + 5] = ((bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11)) + 'A';
    f256[lVar26 + 6] = ((0 < sVar16) * (sVar16 < 0x100) * cVar12 - (0xff < sVar16)) + 'A';
    f256[lVar26 + 7] = ((0 < sVar17) * (sVar17 < 0x100) * cVar13 - (0xff < sVar17)) + 'A';
    f256[lVar26 + 8] = ((bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1)) + 'A';
    f256[lVar26 + 9] = ((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2)) + 'A';
    f256[lVar26 + 10] = ((0 < sVar21) * (sVar21 < 0x100) * cVar3 - (0xff < sVar21)) + 'A';
    f256[lVar26 + 0xb] = ((0 < sVar18) * (sVar18 < 0x100) * cVar29 - (0xff < sVar18)) + 'A';
    f256[lVar26 + 0xc] = ((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4)) + 'A';
    f256[lVar26 + 0xd] = ((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)) + 'A';
    f256[lVar26 + 0xe] = ((0 < sVar19) * (sVar19 < 0x100) * cVar33 - (0xff < sVar19)) + 'A';
    f256[lVar26 + 0xf] = ((0 < sVar20) * (sVar20 < 0x100) * cVar31 - (0xff < sVar20)) + 'A';
    lVar26 = lVar26 + 0x10;
    auVar44._0_4_ = auVar44._0_4_ + 0x10;
    auVar44._4_4_ = uVar52 + 0x10;
    auVar44._8_4_ = iVar58 + 0x10;
    auVar44._12_4_ = iVar50 + 0x10;
    auVar42._0_4_ = auVar42._0_4_ + 0x10;
    auVar42._4_4_ = uVar45 + 0x10;
    auVar42._8_4_ = iVar65 + 0x10;
    auVar42._12_4_ = iVar48 + 0x10;
    auVar37._0_4_ = auVar37._0_4_ + 0x10;
    auVar37._4_4_ = uVar38 + 0x10;
    auVar37._8_4_ = iVar49 + 0x10;
    auVar37._12_4_ = iVar39 + 0x10;
    auVar36._0_4_ = auVar36._0_4_ + 0x10;
    auVar36._4_4_ = uVar30 + 0x10;
    auVar36._8_4_ = iVar59 + 0x10;
    auVar36._12_4_ = iVar25 + 0x10;
  } while (lVar26 != 0x100);
  f256[0x9b] = '/';
  wVar35 = L'\0';
  f256[0x100] = '\0';
  buff = (undefined4 *)malloc(100000);
  _a = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'N',(uint)(_a != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar25 = archive_write_set_format_ustar(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'P',0,"ARCHIVE_OK",(long)iVar25,"archive_write_set_format_ustar(a)",_a);
  iVar25 = archive_write_add_filter_none(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'R',0,"ARCHIVE_OK",(long)iVar25,"archive_write_add_filter_none(a)",_a);
  iVar25 = archive_write_open_memory(_a,buff,100000,&used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'T',0,"ARCHIVE_OK",(long)iVar25,
                      "archive_write_open_memory(a, buff, buffsize, &used)",_a);
  paVar27 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'\\',(uint)(paVar27 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar27,1,10);
  archive_entry_set_pathname(paVar27,"file");
  archive_entry_set_mode(paVar27,0x81b4);
  archive_entry_set_size(paVar27,10);
  archive_entry_set_uid(paVar27,0x50);
  archive_entry_set_gid(paVar27,0x5a);
  archive_entry_set_dev(paVar27,0xc);
  archive_entry_set_ino(paVar27,0x59);
  archive_entry_set_nlink(paVar27,2);
  iVar25 = archive_write_header(_a,paVar27);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'g',0,"ARCHIVE_OK",(long)iVar25,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar27);
  sVar28 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'i',10,"10",sVar28,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar27 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'l',(uint)(paVar27 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar27,1,10);
  archive_entry_set_pathname(paVar27,"linkfile");
  archive_entry_set_mode(paVar27,0x81b4);
  archive_entry_set_uid(paVar27,0x50);
  archive_entry_set_gid(paVar27,0x5a);
  archive_entry_set_dev(paVar27,0xc);
  archive_entry_set_ino(paVar27,0x59);
  archive_entry_set_nlink(paVar27,2);
  iVar25 = archive_write_header(_a,paVar27);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'x',0,"ARCHIVE_OK",(long)iVar25,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar27);
  sVar28 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'{',0,"0",sVar28,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar27 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'~',(uint)(paVar27 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar27,2,0x14);
  archive_entry_set_pathname(paVar27,"dir");
  archive_entry_set_mode(paVar27,0x41fd);
  archive_entry_set_size(paVar27,10);
  archive_entry_set_nlink(paVar27,2);
  iVar25 = archive_write_header(_a,paVar27);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'\x85',0,"ARCHIVE_OK",(long)iVar25,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar27);
  sVar28 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'\x88',0,"0",sVar28,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar27 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'\x8b',(uint)(paVar27 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar27,3,0x1e);
  archive_entry_set_pathname(paVar27,"symlink");
  archive_entry_set_mode(paVar27,0x1b4);
  archive_entry_set_filetype(paVar27,0xa000);
  archive_entry_set_symlink(paVar27,"file");
  archive_entry_set_size(paVar27,0);
  archive_entry_set_uid(paVar27,0x58);
  archive_entry_set_gid(paVar27,0x62);
  archive_entry_set_dev(paVar27,0xc);
  archive_entry_set_ino(paVar27,0x5a);
  archive_entry_set_nlink(paVar27,1);
  iVar25 = archive_write_header(_a,paVar27);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'\x98',0,"ARCHIVE_OK",(long)iVar25,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar27);
  sVar28 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'\x9b',0,"0",sVar28,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar27 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'\x9e',(uint)(paVar27 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar27,1,10);
  archive_entry_set_pathname(paVar27,f99);
  archive_entry_set_mode(paVar27,0x81b4);
  archive_entry_set_size(paVar27,0);
  archive_entry_set_uid(paVar27,0x52);
  archive_entry_set_gid(paVar27,0x5d);
  archive_entry_set_dev(paVar27,0x66);
  archive_entry_set_ino(paVar27,7);
  archive_entry_set_nlink(paVar27,1);
  iVar25 = archive_write_header(_a,paVar27);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'©',0,"ARCHIVE_OK",(long)iVar25,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar27);
  paVar27 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'­',(uint)(paVar27 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar27,1,10);
  archive_entry_set_pathname(paVar27,f100);
  archive_entry_set_mode(paVar27,0x81b4);
  archive_entry_set_size(paVar27,0);
  archive_entry_set_uid(paVar27,0x52);
  archive_entry_set_gid(paVar27,0x5d);
  archive_entry_set_dev(paVar27,0x66);
  archive_entry_set_ino(paVar27,7);
  archive_entry_set_nlink(paVar27,1);
  iVar25 = archive_write_header(_a,paVar27);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'¸',0,"ARCHIVE_OK",(long)iVar25,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar27);
  paVar27 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'¼',(uint)(paVar27 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar27,1,10);
  archive_entry_set_pathname(paVar27,f256);
  archive_entry_set_mode(paVar27,0x81b4);
  archive_entry_set_size(paVar27,0);
  archive_entry_set_uid(paVar27,0x52);
  archive_entry_set_gid(paVar27,0x5d);
  archive_entry_set_dev(paVar27,0x66);
  archive_entry_set_ino(paVar27,7);
  archive_entry_set_nlink(paVar27,1);
  iVar25 = archive_write_header(_a,paVar27);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ç',0,"ARCHIVE_OK",(long)iVar25,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar27);
  iVar25 = archive_write_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ë',0,"ARCHIVE_OK",(long)iVar25,"archive_write_free(a)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ó',buff,"e + 0","file","\"file\"",5,"5",(void *)0x0);
  *buff = 0;
  *(undefined1 *)(buff + 1) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ô',buff + 0x19,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x19) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Õ',buff + 0x1b,"e + 108","000120 ","\"000120 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x1b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ö',buff + 0x1d,"e + 116","000132 ","\"000132 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x1d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'×',buff + 0x1f,"e + 124","00000000012 ","\"00000000012 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x1f) = 0;
  buff[0x21] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ø',buff + 0x22,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x22) = 0;
  buff[0x24] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ù',buff + 0x25,"e + 148","010034","\"010034\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x25) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ú',buff + 0x27,"e + 156","0","\"0\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x27) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Û',(void *)((long)buff + 0x9d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x9d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ü',(void *)((long)buff + 0x101),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0x101) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ý',(void *)((long)buff + 0x109),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x109) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Þ',(void *)((long)buff + 0x129),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x129) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ß',(void *)((long)buff + 0x149),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x149) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'à',(void *)((long)buff + 0x151),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x151) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'á',(void *)((long)buff + 0x159),"e + 345","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x159) = 0;
  lVar26 = 0;
  do {
    if (*(char *)((long)buff + lVar26) != '\0') goto LAB_001d4c09;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0x200);
  wVar35 = L'\x01';
LAB_001d4c09:
  wVar34 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'â',wVar35,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ã',buff + 0x80,"e + 512","1234567890","\"1234567890\"",10,"10",(void *)0x0
                     );
  *(undefined8 *)(buff + 0x80) = 0;
  *(undefined2 *)(buff + 0x82) = 0;
  lVar26 = 0x200;
  do {
    if (*(char *)((long)buff + lVar26) != '\0') goto LAB_001d4c96;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0x400);
  wVar34 = L'\x01';
LAB_001d4c96:
  wVar35 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'ä',wVar34,"is_null(e + 512, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'è',buff + 0x100,"e + 0","linkfile","\"linkfile\"",9,"9",(void *)0x0);
  *(undefined8 *)(buff + 0x100) = 0;
  *(undefined1 *)(buff + 0x102) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'é',buff + 0x119,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x119) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ê',buff + 0x11b,"e + 108","000120 ","\"000120 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x11b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ë',buff + 0x11d,"e + 116","000132 ","\"000132 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x11d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ì',buff + 0x11f,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x11f) = 0;
  buff[0x121] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'í',buff + 0x122,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x122) = 0;
  buff[0x124] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'î',buff + 0x125,"e + 148","010707","\"010707\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x125) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ï',buff + 0x127,"e + 156","0","\"0\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x127) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ð',(void *)((long)buff + 0x49d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x49d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ñ',(void *)((long)buff + 0x501),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0x501) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ò',(void *)((long)buff + 0x509),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x509) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ó',(void *)((long)buff + 0x529),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x529) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ô',(void *)((long)buff + 0x549),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x549) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'õ',(void *)((long)buff + 0x551),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x551) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ö',(void *)((long)buff + 0x559),"e + 345","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x559) = 0;
  lVar26 = -0x200;
  do {
    if (*(char *)((long)buff + lVar26 + 0x600) != '\0') goto LAB_001d50e8;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0);
  wVar35 = L'\x01';
LAB_001d50e8:
  wVar34 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'÷',wVar35,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'û',buff + 0x180,"e + 0","dir/","\"dir/\"",4,"4",(void *)0x0);
  buff[0x180] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ü',buff + 0x199,"e + 100","000775 ","\"000775 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x199) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ý',buff + 0x19b,"e + 108","000000 ","\"000000 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x19b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'þ',buff + 0x19d,"e + 116","000000 ","\"000000 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x19d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ÿ',buff + 0x19f,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x19f) = 0;
  buff[0x1a1] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ā',buff + 0x1a2,"e + 136","00000000002 ","\"00000000002 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x1a2) = 0;
  buff[0x1a4] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ā',buff + 0x1a5,"e + 148","007747","\"007747\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x1a5) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ă',buff + 0x1a7,"e + 156","5","\"5\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x1a7) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ă',(void *)((long)buff + 0x69d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x69d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ą',(void *)((long)buff + 0x701),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0x701) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ą',(void *)((long)buff + 0x709),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x709) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ć',(void *)((long)buff + 0x729),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x729) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ć',(void *)((long)buff + 0x749),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x749) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĉ',(void *)((long)buff + 0x751),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x751) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĉ',(void *)((long)buff + 0x759),"e + 345","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x759) = 0;
  lVar26 = 0x600;
  do {
    if (*(char *)((long)buff + lVar26) != '\0') goto LAB_001d553d;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0x800);
  wVar34 = L'\x01';
LAB_001d553d:
  wVar35 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'Ċ',wVar34,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ď',buff + 0x200,"e + 0","symlink","\"symlink\"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x200) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ď',buff + 0x219,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x219) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Đ',buff + 0x21b,"e + 108","000130 ","\"000130 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x21b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'đ',buff + 0x21d,"e + 116","000142 ","\"000142 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x21d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ē',buff + 0x21f,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x21f) = 0;
  buff[0x221] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ē',buff + 0x222,"e + 136","00000000003 ","\"00000000003 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x222) = 0;
  buff[0x224] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĕ',buff + 0x225,"e + 148","011446","\"011446\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x225) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĕ',buff + 0x227,"e + 156","2","\"2\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x227) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ė',(void *)((long)buff + 0x89d),"e + 157","file","\"file\"",5,"5",
                      (void *)0x0);
  *(undefined4 *)((long)buff + 0x89d) = 0;
  *(undefined1 *)((long)buff + 0x8a1) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ė',(void *)((long)buff + 0x901),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0x901) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ę',(void *)((long)buff + 0x909),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x909) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ę',(void *)((long)buff + 0x929),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x929) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ě',(void *)((long)buff + 0x949),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x949) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ě',(void *)((long)buff + 0x951),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x951) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĝ',(void *)((long)buff + 0x959),"e + 345","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x959) = 0;
  lVar26 = -0x200;
  do {
    if (*(char *)((long)buff + lVar26 + 0xa00) != '\0') goto LAB_001d59a0;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0);
  wVar35 = L'\x01';
LAB_001d59a0:
  wVar34 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'ĝ',wVar35,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ġ',buff + 0x280,"e + 0",f99,"f99",100,"100",(void *)0x0);
  *(undefined1 (*) [16])(buff + 0x280) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x284) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x288) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x28c) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x290) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x294) = (undefined1  [16])0x0;
  buff[0x298] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ģ',buff + 0x299,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x299) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ģ',buff + 0x29b,"e + 108","000122 ","\"000122 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x29b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĥ',buff + 0x29d,"e + 116","000135 ","\"000135 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x29d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĥ',buff + 0x29f,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x29f) = 0;
  buff[0x2a1] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ħ',buff + 0x2a2,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x2a2) = 0;
  buff[0x2a4] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ħ',buff + 0x2a5,"e + 148","034242","\"034242\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x2a5) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĩ',buff + 0x2a7,"e + 156","0","\"0\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x2a7) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĩ',(void *)((long)buff + 0xa9d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xa9d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ī',(void *)((long)buff + 0xb01),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0xb01) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ī',(void *)((long)buff + 0xb09),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xb09) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĭ',(void *)((long)buff + 0xb29),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xb29) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĭ',(void *)((long)buff + 0xb49),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0xb49) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Į',(void *)((long)buff + 0xb51),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0xb51) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'į',(void *)((long)buff + 0xb59),"e + 345","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xb59) = 0;
  lVar26 = -0x200;
  do {
    if (*(char *)((long)buff + lVar26 + 0xc00) != '\0') goto LAB_001d5e1d;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0);
  wVar34 = L'\x01';
LAB_001d5e1d:
  wVar35 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'İ',wVar34,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĵ',buff + 0x300,"e + 0",f100,"f100",100,"100",(void *)0x0);
  *(undefined1 (*) [16])(buff + 0x300) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x304) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x308) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x30c) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x310) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x314) = (undefined1  [16])0x0;
  buff[0x318] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĵ',buff + 0x319,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x319) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ķ',buff + 0x31b,"e + 108","000122 ","\"000122 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x31b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ķ',buff + 0x31d,"e + 116","000135 ","\"000135 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x31d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĸ',buff + 799,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 799) = 0;
  buff[0x321] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĺ',buff + 0x322,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x322) = 0;
  buff[0x324] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĺ',buff + 0x325,"e + 148","026230","\"026230\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x325) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ļ',buff + 0x327,"e + 156","0","\"0\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x327) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ļ',(void *)((long)buff + 0xc9d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xc9d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ľ',(void *)((long)buff + 0xd01),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0xd01) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ľ',(void *)((long)buff + 0xd09),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xd09) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ŀ',(void *)((long)buff + 0xd29),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xd29) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ŀ',(void *)((long)buff + 0xd49),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0xd49) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ł',(void *)((long)buff + 0xd51),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0xd51) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ł',(void *)((long)buff + 0xd59),"e + 345","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xd59) = 0;
  lVar26 = -0x200;
  do {
    if (*(char *)((long)buff + lVar26 + 0xe00) != '\0') goto LAB_001d629d;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0);
  wVar35 = L'\x01';
LAB_001d629d:
  wVar34 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'Ń',wVar35,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ň',buff + 0x380,"e + 0",f256 + 0x9c,"f256 + 156",100,"100",(void *)0x0);
  *(undefined1 (*) [16])(buff + 0x380) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 900) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x388) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x38c) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x390) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x394) = (undefined1  [16])0x0;
  buff[0x398] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ň',buff + 0x399,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x399) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ŉ',buff + 0x39b,"e + 108","000122 ","\"000122 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x39b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ŋ',buff + 0x39d,"e + 116","000135 ","\"000135 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x39d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ŋ',buff + 0x39f,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x39f) = 0;
  buff[0x3a1] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ō',buff + 0x3a2,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x3a2) = 0;
  buff[0x3a4] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ō',buff + 0x3a5,"e + 148","055570","\"055570\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x3a5) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ŏ',buff + 0x3a7,"e + 156","0","\"0\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x3a7) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ŏ',(void *)((long)buff + 0xe9d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xe9d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ő',(void *)((long)buff + 0xf01),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0xf01) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ő',(void *)((long)buff + 0xf09),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xf09) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Œ',(void *)((long)buff + 0xf29),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xf29) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'œ',(void *)((long)buff + 0xf49),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0xf49) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ŕ',(void *)((long)buff + 0xf51),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0xf51) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ŕ',(void *)((long)buff + 0xf59),"e + 345",f256,"f256",0x9b,"155",
                      (void *)0x0);
  memset((void *)((long)buff + 0xf59),0,0x9b);
  lVar26 = 0xe00;
  do {
    if (*(char *)((long)buff + lVar26) != '\0') goto LAB_001d6724;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0x1000);
  wVar34 = L'\x01';
LAB_001d6724:
  wVar35 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'Ŗ',wVar34,"is_null(e + 0, 512)",(void *)0x0);
  lVar26 = -0x400;
  do {
    if (*(char *)((long)buff + lVar26 + 0x1400) != '\0') goto LAB_001d6761;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0);
  wVar35 = L'\x01';
LAB_001d6761:
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'Ŝ',wVar35,"is_null(e, 1024)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ş',(long)(int)used,"(int)used",0x1400,"e - buff",(void *)0x0);
  free(buff);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_tar_ustar)
{
	struct archive *a;
	struct archive_entry *entry;
	char *buff, *e;
	size_t buffsize = 100000;
	size_t used;
	int i;
	char f99[100];
	char f100[101];
	char f256[257];

	for (i = 0; i < 99; ++i)
		f99[i] = 'a' + i % 26;
	f99[99] = '\0';

	for (i = 0; i < 100; ++i)
		f100[i] = 'A' + i % 26;
	f100[100] = '\0';

	for (i = 0; i < 256; ++i)
		f256[i] = 'A' + i % 26;
	f256[155] = '/';
	f256[256] = '\0';

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Add various files to it.
	 * TODO: Extend this to cover more filetypes.
	 */

	/* "file" with 10 bytes of content */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, "file");
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 10);
	archive_entry_set_uid(entry, 80);
	archive_entry_set_gid(entry, 90);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 89);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualIntA(a, 10, archive_write_data(a, "1234567890", 10));

	/* Hardlink to "file" with 10 bytes of content */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, "linkfile");
	archive_entry_set_mode(entry, S_IFREG | 0664);
	/* TODO: Put this back and fix the bug. */
	/* archive_entry_set_size(entry, 10); */
	archive_entry_set_uid(entry, 80);
	archive_entry_set_gid(entry, 90);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 89);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to dir should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* "dir" */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 2, 20);
	archive_entry_set_pathname(entry, "dir");
	archive_entry_set_mode(entry, S_IFDIR | 0775);
	archive_entry_set_size(entry, 10);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to dir should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* "symlink" pointing to "file" */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 3, 30);
	archive_entry_set_pathname(entry, "symlink");
	archive_entry_set_mode(entry, 0664);
	archive_entry_set_filetype(entry, AE_IFLNK);
	archive_entry_set_symlink(entry,"file");
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 88);
	archive_entry_set_gid(entry, 98);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 90);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to symlink should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* file with 99-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f99);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);

	/* file with 100-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f100);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);

	/* file with 256-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f256);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);

	/* Close out the archive. */
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Verify the archive format.
	 */
	e = buff;

	/* "file" */
	myAssertEqualMem(e + 0, "file", 5); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000120 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000132 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000012 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "010034\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	myAssertEqualMem(e + 512, "1234567890", 10);
	assert(is_null(e + 512, 512));
	e += 1024;

	/* hardlink to "file" */
	myAssertEqualMem(e + 0, "linkfile", 9); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000120 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000132 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "010707\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* "dir" */
	myAssertEqualMem(e + 0, "dir/", 4); /* Filename */
	myAssertEqualMem(e + 100, "000775 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000000 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000000 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000002 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "007747\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "5", 1); /* typeflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* "symlink" pointing to "file" */
	myAssertEqualMem(e + 0, "symlink", 8); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000130 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000142 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000003 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "011446\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "2", 1); /* linkflag */
	myAssertEqualMem(e + 157, "file", 5); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* File with 99-char filename */
	myAssertEqualMem(e + 0, f99, 100); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000122 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000135 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "034242\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* File with 100-char filename */
	myAssertEqualMem(e + 0, f100, 100); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000122 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000135 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "026230\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* File with 256-char filename */
	myAssertEqualMem(e + 0, f256 + 156, 100); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000122 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000135 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "055570\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, f256, 155); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* TODO: Verify other types of entries. */

	/* Last entry is end-of-archive marker. */
	assert(is_null(e, 1024));
	e += 1024;

	assertEqualInt((int)used, e - buff);

	free(buff);
}